

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beectl.c
# Opt level: O1

char * get_alternative_editor(void)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = "gvim";
  lVar2 = 0x10;
  do {
    pcVar1 = which(pcVar1,*(size_t *)((long)&__do_global_dtors_aux_fini_array_entry + lVar2));
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    pcVar1 = *(char **)((long)&PTR_anon_var_dwarf_2f4_00108d60 + lVar2);
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x70);
  return (char *)0x0;
}

Assistant:

static char *
get_alternative_editor ()
{
  char *editor = NULL;
  const str_t fallback_editors[] = {
#ifdef WINDOWS
        { .name = "gedit.exe",        .size = sizeof ("gedit.exe")        },
        { .name = "sublime_text.exe", .size = sizeof ("sublime_text.exe") },
        { .name = "notepad++.exe",    .size = sizeof ("notepad++.exe")    },
        { .name = "notepad.exe",      .size = sizeof ("notepad.exe")      },
#else
        { .name = "gvim",     .size = sizeof ("gvim")     },
        { .name = "sublime",  .size = sizeof ("sublime")  },
        { .name = "gedit",    .size = sizeof ("gedit")    },
        { .name = "kate",     .size = sizeof ("kate")     },
        { .name = "mousepad", .size = sizeof ("mousepad") },
        { .name = "leafpad",  .size = sizeof ("leafpad")  },
#endif
        { .name = NULL, .size = 0 },
  };

  for (unsigned i = 0; fallback_editors[i].name != NULL; i++)
    {
      editor = which (fallback_editors[i].name, fallback_editors[i].size);
      if (editor != NULL)
        return editor;
    }

  return NULL;
}